

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,5u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,
          LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> **args,uint *args_1,
          uint *args_2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  pointer p;
  undefined8 uVar6;
  pointer pEVar7;
  pointer pEVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  pointer pEVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar5 = this->cap;
  if (uVar14 < uVar5 * 2) {
    uVar14 = uVar5 * 2;
  }
  if (0x7ffffffffffffff - uVar5 < uVar5) {
    uVar14 = 0x7ffffffffffffff;
  }
  lVar15 = (long)pos - (long)this->data_;
  pEVar11 = (pointer)operator_new(uVar14 << 4);
  uVar3 = *args_1;
  uVar4 = *args_2;
  *(LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> **)((long)pEVar11 + lVar15) =
       *args;
  *(uint *)((long)pEVar11 + lVar15 + 8) = uVar3;
  *(uint *)((long)pEVar11 + lVar15 + 0xc) = uVar4;
  p = this->data_;
  lVar12 = this->len * 0x10;
  lVar13 = (long)p + (lVar12 - (long)pos);
  pEVar7 = p;
  pEVar8 = pEVar11;
  if (lVar13 == 0) {
    if (this->len != 0) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->node + lVar13);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar11->node + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar13 = lVar13 + 0x10;
      } while (lVar12 != lVar13);
    }
  }
  else {
    for (; pEVar7 != pos; pEVar7 = pEVar7 + 1) {
      uVar9 = pEVar7->size;
      uVar10 = pEVar7->offset;
      pEVar8->node = pEVar7->node;
      pEVar8->size = uVar9;
      pEVar8->offset = uVar10;
      pEVar8 = pEVar8 + 1;
    }
    memcpy((void *)((long)pEVar11 + lVar15 + 0x10),pos,(lVar13 - 0x10U & 0xfffffffffffffff0) + 0x10)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = pEVar11;
  return (pointer)((long)pEVar11 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}